

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

vector<Matrix<double>,_std::allocator<Matrix<double>_>_> * __thiscall
DataSet::compile(vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *__return_storage_ptr__,
                DataSet *this,uint n_output)

{
  uint end_col;
  Matrix<double> MStack_78;
  
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::vector
            (__return_storage_ptr__,2,(allocator_type *)&MStack_78);
  Matrix<double>::compile(&MStack_78,&this->m_matrix,0,(this->m_matrix).m_shape.n_col - n_output);
  Matrix<double>::operator=
            ((__return_storage_ptr__->
             super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start,&MStack_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&MStack_78.m_elems);
  end_col = (this->m_matrix).m_shape.n_col;
  Matrix<double>::compile(&MStack_78,&this->m_matrix,end_col - n_output,end_col);
  Matrix<double>::operator=
            ((__return_storage_ptr__->
             super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start + 1,&MStack_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&MStack_78.m_elems);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Matrix_d> DataSet::compile(unsigned n_output) const{
    std::vector<Matrix_d> matrices(2);
    
    matrices[0]=m_matrix.compile(0, m_matrix.shape().n_col-n_output);
    matrices[1]=m_matrix.compile(m_matrix.shape().n_col-n_output, m_matrix.shape().n_col);

    return matrices;
}